

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<long,_6> * __thiscall
TPZManVector<long,_6>::operator=(TPZManVector<long,_6> *this,TPZManVector<long,_6> *copy)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<long>).fNElements;
    lVar3 = (this->super_TPZVec<long>).fNAlloc;
    if ((lVar3 < (long)uVar1) &&
       (plVar4 = (this->super_TPZVec<long>).fStore,
       plVar4 != this->fExtAlloc && plVar4 != (long *)0x0)) {
      operator_delete__(plVar4);
      lVar3 = 0;
      (this->super_TPZVec<long>).fStore = (long *)0x0;
      (this->super_TPZVec<long>).fNAlloc = 0;
    }
    if ((long)uVar1 < 7) {
      plVar4 = (this->super_TPZVec<long>).fStore;
      if (plVar4 != (long *)0x0 && plVar4 != this->fExtAlloc) {
        operator_delete__(plVar4);
      }
      (this->super_TPZVec<long>).fNAlloc = 0;
      (this->super_TPZVec<long>).fStore = this->fExtAlloc;
      (this->super_TPZVec<long>).fNElements = uVar1;
      if ((long)uVar1 < 1) {
        return this;
      }
    }
    else {
      if (lVar3 < (long)uVar1) {
        plVar4 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
        (this->super_TPZVec<long>).fStore = plVar4;
        (this->super_TPZVec<long>).fNAlloc = uVar1;
      }
      (this->super_TPZVec<long>).fNElements = uVar1;
    }
    plVar4 = (copy->super_TPZVec<long>).fStore;
    plVar2 = (this->super_TPZVec<long>).fStore;
    uVar5 = 0;
    do {
      plVar2[uVar5] = plVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}